

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::loadFreqMap(char *fname,TFreqMap *res,double pmin)

{
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *this;
  size_type *__k;
  mapped_type mVar1;
  _Hash_node_base *p_Var2;
  double dVar3;
  pointer piVar4;
  TCode TVar5;
  uint uVar6;
  int iVar7;
  istream *piVar8;
  mapped_type *pmVar9;
  long lVar10;
  long lVar11;
  mapped_type *pmVar12;
  int i;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  int *mask;
  uint *puVar16;
  _Hash_node_base *p_Var17;
  uint uVar18;
  int i_1;
  int iVar19;
  __node_base *p_Var20;
  int m;
  ulong uVar21;
  int64_t nfreq;
  uint local_2f4;
  double local_2f0;
  vector<int,_std::allocator<int>_> masks;
  TCode idx;
  undefined4 uStack_2c4;
  size_type local_2c0;
  __node_base local_2b8;
  ulong uStack_2b0;
  float local_2a8;
  size_t local_2a0;
  __node_base_ptr p_Stack_298;
  string gram;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  pi64;
  ifstream fin;
  byte abStack_218 [488];
  
  this = &res->prob;
  res->len = 0;
  local_2f0 = pmin;
  std::
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this->_M_h);
  printf("[+] Loading n-gram file \'%s\'\n",fname);
  std::ifstream::ifstream(&fin,fname,_S_in);
  if (*(int *)(abStack_218 + *(long *)(_fin + -0x18)) == 0) {
    gram._M_dataplus._M_p = (pointer)&gram.field_2;
    gram._M_string_length = 0;
    gram.field_2._M_local_buf[0] = '\0';
    res->nTotal = 0;
    pi64._M_h._M_buckets = &pi64._M_h._M_single_bucket;
    pi64._M_h._M_bucket_count = 1;
    pi64._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pi64._M_h._M_element_count = 0;
    pi64._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    pi64._M_h._M_rehash_policy._M_next_resize = 0;
    pi64._M_h._M_single_bucket = (__node_base_ptr)0x0;
    while( true ) {
      piVar8 = std::operator>>((istream *)&fin,(string *)&gram);
      std::istream::_M_extract<long>((long *)piVar8);
      if ((abStack_218[*(long *)(_fin + -0x18)] & 2) != 0) break;
      iVar13 = res->len;
      if (iVar13 == 0) {
        res->len = (int)gram._M_string_length;
        iVar13 = (int)gram._M_string_length;
      }
      else if (iVar13 != (int)gram._M_string_length) {
        puts("Error: loaded n-grams with vaying lengths");
        goto LAB_0014a4b8;
      }
      TVar5 = calcCode(gram._M_dataplus._M_p,iVar13);
      _idx = (__node_base_ptr *)CONCAT44(uStack_2c4,TVar5);
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pi64,&idx);
      if (0 < *pmVar9) {
        bVar15 = false;
        printf("Error: duplicate n-gram \'%s\'\n",gram._M_dataplus._M_p);
        goto LAB_0014a4ba;
      }
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pi64,&idx);
      *pmVar9 = 0;
      res->nTotal = res->nTotal;
    }
    printf("    Total n-grams loaded = %g\n",SUB84((double)res->nTotal,0));
    lVar10 = std::chrono::_V2::steady_clock::now();
    std::vector<int,_std::allocator<int>_>::vector
              (&masks,(ulong)(uint)~(-1 << ((byte)res->len & 0x1f)),(allocator_type *)&idx);
    for (uVar21 = 0;
        piVar4 = masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start,
        (long)uVar21 <
        (long)(int)((ulong)((long)masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2); uVar21 = uVar21 + 1) {
      masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar21] = 0;
      uVar6 = 0;
      uVar14 = uVar21 & 0xffffffff;
      uVar18 = 0x1f;
      for (iVar13 = 0; iVar13 < res->len; iVar13 = iVar13 + 1) {
        if ((uVar14 & 1) != 0) {
          uVar6 = uVar6 | uVar18;
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar21] = uVar6;
        }
        uVar14 = uVar14 >> 1;
        uVar18 = uVar18 << 5;
      }
      printf("    Mask %2d: ",uVar21 & 0xffffffff);
      iVar13 = -1;
      for (iVar19 = 0; iVar7 = res->len * 5, iVar19 < iVar7; iVar19 = iVar19 + 1) {
        printf("%d",(ulong)(((uint)piVar4[uVar21] >> (iVar7 + iVar13 & 0x1fU) & 1) != 0));
        iVar13 = iVar13 + -1;
      }
      putchar(10);
    }
    _idx = &p_Stack_298;
    local_2c0 = 1;
    local_2b8._M_nxt = (_Hash_node_base *)0x0;
    uStack_2b0 = 0;
    local_2a8 = 1.0;
    local_2a0 = 0;
    p_Stack_298 = (__node_base_ptr)0x0;
    p_Var20 = &pi64._M_h._M_before_begin;
    while( true ) {
      piVar4 = masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      p_Var17 = &local_2b8;
      p_Var20 = p_Var20->_M_nxt;
      if (p_Var20 == (__node_base *)0x0) break;
      puVar16 = (uint *)masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      if (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var20 + 2))->_M_max_load_factor ==
          (_Hash_node_base *)0x0) {
        printf("i = %d, p == 0 - should not happen\n",(ulong)(uint)*(size_type *)(p_Var20 + 1));
        std::
        _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&idx);
        goto LAB_0014a4ae;
      }
      for (; puVar16 != (uint *)piVar4; puVar16 = puVar16 + 1) {
        p_Var17 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var20 + 2))->_M_max_load_factor;
        local_2f4 = *puVar16 & (uint)*(size_type *)(p_Var20 + 1);
        pmVar9 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&idx,(key_type *)&local_2f4);
        *pmVar9 = (long)&p_Var17->_M_nxt + *pmVar9;
      }
    }
    printf("Size of pwild = %d\n",uStack_2b0 & 0xffffffff);
    p_Var20 = &pi64._M_h._M_before_begin;
    while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
      p_Var2 = p_Var17[2]._M_nxt;
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pi64,(key_type *)(p_Var17 + 1));
      *pmVar9 = (mapped_type)p_Var2;
    }
    printf("Size of pi64 = %d\n",pi64._M_h._M_element_count & 0xffffffff);
    std::
    _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&idx);
    _idx = (__node_base_ptr *)((ulong)_idx & 0xffffffff00000000);
    pmVar9 = std::__detail::
             _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pi64,&idx);
    if (*pmVar9 == res->nTotal) {
      lVar11 = std::chrono::_V2::steady_clock::now();
      printf("    Wildcard probabilities computed in %g ms\n",
             SUB84((double)((lVar11 - lVar10) / 1000000),0));
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&masks.super__Vector_base<int,_std::allocator<int>_>);
      lVar10 = std::chrono::_V2::steady_clock::now();
      dVar3 = log10(local_2f0);
      res->pmin = (float)dVar3;
      printf("    P-min = %g\n",SUB84((double)(float)dVar3,0));
      while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
        __k = (size_type *)(p_Var20 + 1);
        if (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var20 + 2))->_M_max_load_factor ==
            (_Hash_node_base *)0x0) {
          bVar15 = false;
          printf("i = %d, p == 0 - should not happen\n",(ulong)(uint)*__k);
          goto LAB_0014a4ba;
        }
        dVar3 = (double)(long)*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var20 + 2))->_M_max_load_factor /
                (double)res->nTotal;
        if (local_2f0 <= dVar3) {
          dVar3 = log10(dVar3);
          pmVar12 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,(key_type *)__k);
          *pmVar12 = (float)dVar3;
        }
        else {
          mVar1 = res->pmin;
          pmVar12 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,(key_type *)__k);
          *pmVar12 = mVar1;
        }
      }
      lVar11 = std::chrono::_V2::steady_clock::now();
      bVar15 = true;
      printf("    Probability computation time = %g ms\n",
             SUB84((double)((lVar11 - lVar10) / 1000000),0));
    }
    else {
      _idx = (__node_base_ptr *)((ulong)_idx & 0xffffffff00000000);
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pi64,&idx);
      printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n",*pmVar9,res->nTotal
            );
LAB_0014a4ae:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&masks.super__Vector_base<int,_std::allocator<int>_>);
LAB_0014a4b8:
      bVar15 = false;
    }
LAB_0014a4ba:
    std::
    _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&pi64._M_h);
    std::__cxx11::string::~string((string *)&gram);
  }
  else {
    puts("    Failed to open file");
    bVar15 = false;
  }
  std::ifstream::~ifstream(&fin);
  return bVar15;
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res, double pmin) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int64_t nfreq = 0;
        res.nTotal = 0;

        std::unordered_map<TCode, int64_t> pi64;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (pi64[idx] > 0) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            pi64[idx] = nfreq;
            res.nTotal += nfreq;
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        // compute wildcard frequencies
        {
            const auto tStart = std::chrono::steady_clock::now();

            std::vector<int32_t> masks((1 << len) - 1);
            for (int m = 0; m < (int) masks.size(); ++m) {
                auto & mask = masks[m];

                mask = 0;
                int32_t l = 0b11111;
                int32_t mm = m;
                for (int i = 0; i < len; ++i) {
                    if (mm & 1) {
                        mask |= l;
                    }
                    mm >>= 1;
                    l <<= 5;
                }

                // print mask in binary
                printf("    Mask %2d: ", m);
                for (int i = 0; i < 5*len; ++i) {
                    printf("%d", (mask >> (5*len - 1 - i)) & 1);
                }
                printf("\n");
            }

            {
                std::unordered_map<TCode, int64_t> pwild;
                for (const auto & [i, p] : pi64) {
                    if (p == 0) {
                        printf("i = %d, p == 0 - should not happen\n", i);
                        return false;
                    }

                    for (const auto & mask : masks) {
                        pwild[i & mask] += p;
                    }
                }

                printf("Size of pwild = %d\n", (int) pwild.size());

                for (auto & [i, p] : pwild) {
                    pi64[i] = p;
                }

                printf("Size of pi64 = %d\n", (int) pi64.size());
            }

            if (pi64[0] != res.nTotal) {
                printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n", (long) pi64[0], (long) res.nTotal);
                return false;
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Wildcard probabilities computed in %g ms\n", (double) tDiff);
        }

        // compute probabilities
        {
            const auto tStart = std::chrono::steady_clock::now();

            res.pmin = std::log10(pmin);
            printf("    P-min = %g\n", res.pmin);

            for (auto & [i, p] : pi64) {
                if (p == 0) {
                    printf("i = %d, p == 0 - should not happen\n", i);
                    return false;
                } else {
                    double pp = double(p)/res.nTotal;
                    if (pp < pmin) {
                        prob[i] = res.pmin;
                    } else {
                        prob[i] = std::log10(pp);
                    }
                }
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Probability computation time = %g ms\n", (double) tDiff);
        }

        return true;
    }